

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O0

thread_ret_t ggml_graph_compute_secondary_thread(void *data)

{
  _Bool _Var1;
  long in_RDI;
  ggml_threadpool *threadpool;
  ggml_compute_state *state;
  void *in_stack_00000040;
  _Bool *in_stack_00000098;
  pthread_mutex_t *__mutex;
  
  __mutex = *(pthread_mutex_t **)(in_RDI + 0x210);
  ggml_thread_apply_priority((int32_t)data);
  _Var1 = ggml_thread_cpumask_is_valid((_Bool *)(in_RDI + 8));
  if (_Var1) {
    ggml_thread_apply_affinity(in_stack_00000098);
  }
  while( true ) {
    while ((*(byte *)((long)__mutex + 0x105) & 1) != 0) {
      pthread_mutex_lock(__mutex);
      if ((*(byte *)((long)__mutex + 0x105) & 1) != 0) {
        pthread_cond_wait((pthread_cond_t *)(__mutex + 1),__mutex);
      }
      pthread_mutex_unlock(__mutex);
    }
    if ((*(byte *)((long)__mutex + 0x104) & 1) != 0) break;
    ggml_graph_compute_check_for_work((ggml_compute_state *)&__mutex->__data);
    if ((*(byte *)(in_RDI + 0x20c) & 1) != 0) {
      *(undefined1 *)(in_RDI + 0x20c) = 0;
      ggml_graph_compute_thread(in_stack_00000040);
    }
  }
  return (thread_ret_t)0x0;
}

Assistant:

static thread_ret_t ggml_graph_compute_secondary_thread(void* data) {
    struct ggml_compute_state * state = (struct ggml_compute_state *) data;
    struct ggml_threadpool * threadpool = state->threadpool;

    ggml_thread_apply_priority(threadpool->prio);
    if (ggml_thread_cpumask_is_valid(state->cpumask)) {
        ggml_thread_apply_affinity(state->cpumask);
    }

    while (true) {
        // Check if we need to sleep
        while (threadpool->pause) {
            GGML_PRINT_DEBUG("thread #%d inside pause loop\n", state->ith);
            ggml_mutex_lock_shared(&threadpool->mutex);
            if (threadpool->pause) {
                ggml_cond_wait(&threadpool->cond, &threadpool->mutex);
            }
            GGML_PRINT_DEBUG("thread #%d resuming after wait\n", state->ith);
            ggml_mutex_unlock_shared(&threadpool->mutex);
        }

        // This needs to be checked for after the cond_wait
        if (threadpool->stop) break;

        // Check if there is new work
        // The main thread is the only one that can dispatch new work

        ggml_graph_compute_check_for_work(state);
        if (state->pending) {
            state->pending = false;

            ggml_graph_compute_thread(state);
        }
    }

    return (thread_ret_t) 0;
}